

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Sintatico::comando_sem_rotulo(Sintatico *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  string local_58;
  string local_38;
  
  switch(this->tok) {
  case 0x1f:
    condicional(this);
    return;
  case 0x20:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
    goto switchD_00102bc6_caseD_20;
  case 0x21:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"then","");
    error(this,&local_38);
  case 0x2a:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"while","");
    error(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  case 0x22:
    composto(this);
    return;
  case 0x29:
    repetitivo(this);
    return;
  default:
    if (this->tok == 2) {
      identificador(this);
      bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x1b);
      if (!bVar1) {
        chamada_de_procedimento(this);
        return;
      }
      eat(this,0x1b);
      expressao(this);
      return;
    }
switchD_00102bc6_caseD_20:
    while (((uint)this->tok < 0x18 && ((0x980000U >> (this->tok & 0x1fU) & 1) != 0))) {
      avancar(this);
    }
    return;
  }
}

Assistant:

void Sintatico::comando_sem_rotulo() {
  switch (tok) {
    case BEGIN: composto(); break;
    case IF   : condicional(); break;
    case ELSE : error("then");
    case WHILE: repetitivo(); break;
    case DO : error("while");
    case LETRA:
      identificador();
      if (isEqual(tok, DOISPONTOSIGUAL))
        atribuicao();
      else chamada_de_procedimento();
      break;
    default: saltBlank();
  }
}